

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_result.hpp
# Opt level: O2

const_string __thiscall boost::test_tools::assertion_result::message(assertion_result *this)

{
  type this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  element_type *peVar2;
  pointer pcVar3;
  iterator in_RDX;
  iterator extraout_RDX;
  long in_RSI;
  const_string cVar4;
  
  if (*(long *)(in_RSI + 8) == 0) {
    pcVar3 = "";
    peVar2 = (element_type *)&unit_test::basic_cstring<char_const>::null_str()::null;
  }
  else {
    this_00 = shared_ptr<boost::basic_wrap_stringstream<char>_>::operator->
                        ((shared_ptr<boost::basic_wrap_stringstream<char>_> *)(in_RSI + 8));
    pbVar1 = basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
    peVar2 = (element_type *)(pcVar3 + pbVar1->_M_string_length);
    in_RDX = extraout_RDX;
  }
  *(pointer *)this = pcVar3;
  (this->m_message).px = peVar2;
  cVar4.m_end = in_RDX;
  cVar4.m_begin = (iterator)this;
  return cVar4;
}

Assistant:

const_string        message() const                   { return !m_message ? const_string() : const_string( m_message->str() ); }